

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O2

uint64_t compress_bits(uint64_t x,int n)

{
  ulong *puVar1;
  int i;
  
  puVar1 = even_bit_esz_masks + (uint)n;
  for (; n < 5; n = n + 1) {
    x = x & *puVar1 | (x & *puVar1) >> ((byte)(1 << ((byte)n & 0x1f)) & 0x3f);
    puVar1 = puVar1 + 1;
  }
  return x & 0xffffffff;
}

Assistant:

static uint64_t compress_bits(uint64_t x, int n)
{
    int i;

    for (i = n; i <= 4; i++) {
        int sh = 1 << i;
        x &= even_bit_esz_masks[i];
        x = (x >> sh) | x;
    }
    return x & 0xffffffffu;
}